

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O1

void Json_Extract(char *pFileName,Abc_Nam_t *pStr,Vec_Wec_t *vObjs)

{
  uint in_EAX;
  FILE *__s;
  int Count;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  fwrite("# Data extracted from JSON file:\n",0x21,1,__s);
  if (0 < vObjs->nSize) {
    Json_Extract_rec((FILE *)__s,pStr,vObjs,vObjs->pArray,0,(int *)((long)&uStack_28 + 4));
    fputc(10,__s);
    fclose(__s);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Json_Extract( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs )
{
    int Count = 0;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    fprintf( pFile, "# Data extracted from JSON file:\n" );
    Json_Extract_rec( pFile, pStr, vObjs, Vec_WecEntry(vObjs, 0), 0, &Count );
    fprintf( pFile, "\n" );
    fclose( pFile );
}